

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

void pbrt::HaltonSampler::extendedGCD(uint64_t a,uint64_t b,int64_t *x,int64_t *y)

{
  int64_t yp;
  int64_t xp;
  long local_38;
  long local_30;
  
  if (b == 0) {
    *x = 1;
    *y = 0;
  }
  else {
    extendedGCD(b,a % b,&local_30,&local_38);
    *x = local_38;
    *y = local_30 - (a / b) * local_38;
  }
  return;
}

Assistant:

static void extendedGCD(uint64_t a, uint64_t b, int64_t *x, int64_t *y) {
        if (b == 0) {
            *x = 1;
            *y = 0;
            return;
        }
        int64_t d = a / b, xp, yp;
        extendedGCD(b, a % b, &xp, &yp);
        *x = yp;
        *y = xp - (d * yp);
    }